

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O3

ALenum GetOpenALFormat(uint8_t channels)

{
  ALenum AVar1;
  ALenum AVar2;
  undefined3 in_register_00000039;
  
  AVar2 = 0x1103;
  if (CONCAT31(in_register_00000039,channels) != 2) {
    AVar2 = 0;
  }
  AVar1 = 0x1101;
  if (CONCAT31(in_register_00000039,channels) != 1) {
    AVar1 = AVar2;
  }
  return AVar1;
}

Assistant:

ALenum GetOpenALFormat(uint8_t channels) {
    switch (channels) {
        case 1:
            return AL_FORMAT_MONO16;
        case 2:
            return AL_FORMAT_STEREO16;
        default:
            return 0;
    }
}